

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

CPscl cp_decl_spec(CPState *cp,CPDecl *decl,CPscl scl)

{
  byte *pbVar1;
  GCstr *pGVar2;
  CTState *cts;
  CType *pCVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  anon_union_4_2_43a9a9ed_for_CPValue_0 aVar8;
  ulong uVar9;
  CTypeID CVar10;
  CTypeID CVar11;
  CTypeID CVar12;
  uint uVar13;
  CPDeclIdx CVar14;
  ErrMsg em;
  ulong uVar15;
  CTInfo CVar16;
  CPToken tok;
  uint uVar17;
  uint uVar18;
  CTInfo CVar19;
  uint uVar20;
  CPValue k;
  anon_union_4_2_43a9a9ed_for_CPValue_0 local_58;
  CTypeID CStack_54;
  uint local_50;
  CTypeID local_4c;
  CPDecl *local_48;
  ulong local_40;
  CType *local_38;
  
  decl->cp = cp;
  decl->mode = cp->mode;
  uVar15 = 0;
  decl->attr = 0;
  decl->fattr = 0;
  decl->top = 0;
  decl->pos = 0;
  decl->stack[0].next = 0;
  decl->name = (GCstr *)0x0;
  decl->redir = (GCstr *)0x0;
  uVar18 = 0;
  CVar11 = 0;
  local_50 = scl;
  local_48 = decl;
  do {
    cp_decl_attributes(cp,decl);
    tok = cp->tok;
    uVar9 = uVar15;
    CVar10 = CVar11;
    uVar20 = uVar18;
    CVar12 = local_4c;
    uVar7 = local_40;
    while (local_4c = CVar10, local_40 = uVar9, 0x13 < tok - 0x10dU) {
      bVar5 = uVar20 != 0;
      bVar6 = CVar11 != 0;
      if ((bVar5 || bVar6) || ((uVar15 & 0x7a0) != 0)) {
        CVar12 = local_4c;
        if (bVar5 || bVar6) {
          CVar12 = CVar11;
        }
        CVar11 = CVar12;
        uVar18 = 0;
        if (bVar5 || bVar6) {
          uVar18 = uVar20;
        }
        goto LAB_00149a7f;
      }
      uVar18 = 0;
      if (tok < 0x127) {
        if (tok == 0x24) {
          CVar11 = (cp->val).id;
        }
        else {
          if ((tok != 0x100) || (uVar20 = cp->ct->info, (uVar20 & 0xf0000000) != 0x70000000))
          goto LAB_00149a7f;
          CVar11 = uVar20 & 0xffff;
        }
        cp_next(cp);
      }
      else if (tok == 0x129) {
        CVar11 = cp_struct_name(cp,decl,0x50000001);
        if (cp->tok == 0x7b) {
          cp_next(cp);
          _local_58 = 0x900000000;
          CVar19 = 0x5002000a;
          CVar16 = 0x5002000a;
          CVar12 = CVar11;
          do {
            uVar15 = (ulong)CVar12;
            if (cp->tok != 0x100) {
              cp_err_token(cp,0x100);
            }
            pGVar2 = cp->str;
            if ((cp->val).id != 0) {
              cp_errmsg(cp,0,LJ_ERR_FFI_REDEF,pGVar2 + 1);
            }
            cp_next(cp);
            if (cp->tok == 0x3d) {
              cp_next(cp);
              cp_expr_kint(cp,(CPValue *)&local_58);
              if (CStack_54 == 10) {
                if (-1 < local_58.i32) {
                  _local_58 = CONCAT44(9,local_58.i32);
                }
              }
              else {
                _local_58 = CONCAT44(9,local_58.i32);
                CVar16 = CVar19;
                if (local_58.i32 < 0) {
                  CVar19 = 0x50020009;
                  CVar16 = 0x50020009;
                }
              }
            }
            CVar12 = lj_ctype_new(cp->cts,&local_38);
            cts = cp->cts;
            cts->tab[uVar15].sib = (CTypeID1)CVar12;
            pGVar2->marked = pGVar2->marked | 0x20;
            (local_38->name).gcptr64 = (uint64_t)pGVar2;
            local_38->info = (CStack_54 | 0x2000000) + 0xb0000000;
            aVar8.i32 = local_58.i32;
            _local_58 = CONCAT44(CStack_54,local_58.i32 + 1);
            local_38->size = (CTSize)aVar8;
            lj_ctype_addname(cts,local_38,CVar12);
          } while ((cp->tok == 0x2c) && (cp_next(cp), cp->tok != 0x7d));
          cp_check(cp,0x7d);
          pCVar3 = cp->cts->tab;
          pCVar3[CVar11].info = CVar16;
          pCVar3[CVar11].size = 4;
          uVar15 = local_40;
          decl = local_48;
        }
      }
      else {
        if (tok == 0x128) {
          CVar16 = 0x10800000;
        }
        else {
          if (tok != 0x127) goto LAB_00149a7f;
          CVar16 = 0x10000000;
        }
        CVar11 = cp_decl_struct(cp,decl,CVar16);
      }
      cp_decl_attributes(cp,decl);
      uVar20 = 0;
      uVar9 = local_40;
      CVar10 = local_4c;
      CVar12 = local_4c;
      uVar7 = local_40;
      tok = cp->tok;
    }
    uVar17 = cp->ct->size;
    uVar18 = uVar20;
    local_4c = CVar12;
    local_40 = uVar7;
    if ((uVar17 == 0) || (uVar18 = uVar17, uVar20 == 0)) {
      uVar20 = 1 << ((byte)(tok - 0xdU) & 0x1f);
      uVar15 = (ulong)((uint)uVar15 | (uVar20 & (uint)uVar15) * 2 & 0x40 | 1 << (tok - 0xdU & 0x1f))
      ;
      if (tok < 0x11c) {
        if (CVar11 != 0) {
          bVar5 = false;
          goto LAB_00149a60;
        }
      }
      else if ((local_50 & uVar20) == 0) {
        em = LJ_ERR_FFI_BADSCL;
        goto LAB_00149bf2;
      }
      cp_next(cp);
      bVar5 = true;
    }
    else {
      bVar5 = false;
      uVar18 = uVar20;
    }
LAB_00149a60:
  } while (bVar5);
LAB_00149a7f:
  uVar20 = (uint)uVar15;
  CVar12 = (uVar18 != 4) + 0xf;
  if ((uVar20 >> 8 & 1) == 0) {
    CVar12 = CVar11;
  }
  if (CVar12 == 0) {
    if ((uVar15 & 1) == 0) {
      uVar13 = (uVar20 & 0x400) << 0xd;
      if ((uVar15 & 2) == 0) {
        if ((uVar15 & 0x10) == 0) {
          uVar17 = uVar18;
          if ((((uVar15 & 4) == 0) && (uVar17 = 2, -1 < (char)uVar15)) &&
             (uVar17 = 8, (uVar15 & 0x40) == 0)) {
            if ((uVar15 & 0x20) == 0) {
              uVar17 = uVar18;
              if ((uVar18 == 0) && (uVar17 = 4, (uVar15 & 0x600) == 0)) {
                tok = cp->tok;
                em = LJ_ERR_FFI_DECLSPEC;
                goto LAB_00149bf2;
              }
            }
            else {
              uVar13 = uVar13 | 0x400000;
            }
          }
        }
        else {
          uVar17 = 0x10;
          if ((uVar15 & 0x20) == 0) {
            uVar17 = uVar18;
          }
          uVar13 = 0x4000000;
        }
      }
      else {
        if ((uVar15 & 0xfff079f4) != 0) {
          tok = 0;
          em = LJ_ERR_FFI_INVTYPE;
LAB_00149bf2:
          cp_errmsg(cp,tok,em);
        }
        uVar13 = uVar13 | 0x8000000;
        if ((uVar20 >> 9 & 1) == 0) {
          uVar13 = 0x8800000;
        }
        uVar17 = uVar18 + (uVar18 == 0);
      }
      iVar4 = 0x1f;
      if (uVar17 != 0) {
        for (; uVar17 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      CVar16 = (decl->attr & 0x3000000) + uVar13 + iVar4 * 0x10000;
    }
    else {
      CVar16 = decl->attr & 0x3000000 | 0x40000000;
      uVar17 = 0xffffffff;
    }
    CVar14 = cp_add(decl,CVar16,uVar17);
    decl->pos = CVar14;
    pbVar1 = (byte *)((long)&decl->attr + 3);
    *pbVar1 = *pbVar1 & 0xfc;
  }
  else {
    cp_push_type(decl,CVar12);
  }
  decl->specpos = decl->pos;
  decl->specattr = decl->attr;
  decl->specfattr = decl->fattr;
  return uVar20 & 0xf8000;
}

Assistant:

static CPscl cp_decl_spec(CPState *cp, CPDecl *decl, CPscl scl)
{
  uint32_t cds = 0, sz = 0;
  CTypeID tdef = 0;

  decl->cp = cp;
  decl->mode = cp->mode;
  decl->name = NULL;
  decl->redir = NULL;
  decl->attr = 0;
  decl->fattr = 0;
  decl->pos = decl->top = 0;
  decl->stack[0].next = 0;

  for (;;) {  /* Parse basic types. */
    cp_decl_attributes(cp, decl);
    if (cp->tok >= CTOK_FIRSTDECL && cp->tok <= CTOK_LASTDECLFLAG) {
      uint32_t cbit;
      if (cp->ct->size) {
	if (sz) goto end_decl;
	sz = cp->ct->size;
      }
      cbit = (1u << (cp->tok - CTOK_FIRSTDECL));
      cds = cds | cbit | ((cbit & cds & CDF_LONG) << 1);
      if (cp->tok >= CTOK_FIRSTSCL) {
	if (!(scl & cbit)) cp_errmsg(cp, cp->tok, LJ_ERR_FFI_BADSCL);
      } else if (tdef) {
	goto end_decl;
      }
      cp_next(cp);
      continue;
    }
    if (sz || tdef ||
	(cds & (CDF_SHORT|CDF_LONG|CDF_SIGNED|CDF_UNSIGNED|CDF_COMPLEX)))
      break;
    switch (cp->tok) {
    case CTOK_STRUCT:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, 0));
      continue;
    case CTOK_UNION:
      tdef = cp_decl_struct(cp, decl, CTINFO(CT_STRUCT, CTF_UNION));
      continue;
    case CTOK_ENUM:
      tdef = cp_decl_enum(cp, decl);
      continue;
    case CTOK_IDENT:
      if (ctype_istypedef(cp->ct->info)) {
	tdef = ctype_cid(cp->ct->info);  /* Get typedef. */
	cp_next(cp);
	continue;
      }
      break;
    case '$':
      tdef = cp->val.id;
      cp_next(cp);
      continue;
    default:
      break;
    }
    break;
  }
end_decl:

  if ((cds & CDF_COMPLEX))  /* Use predefined complex types. */
    tdef = sz == 4 ? CTID_COMPLEX_FLOAT : CTID_COMPLEX_DOUBLE;

  if (tdef) {
    cp_push_type(decl, tdef);
  } else if ((cds & CDF_VOID)) {
    cp_push(decl, CTINFO(CT_VOID, (decl->attr & CTF_QUAL)), CTSIZE_INVALID);
    decl->attr &= ~CTF_QUAL;
  } else {
    /* Determine type info and size. */
    CTInfo info = CTINFO(CT_NUM, (cds & CDF_UNSIGNED) ? CTF_UNSIGNED : 0);
    if ((cds & CDF_BOOL)) {
      if ((cds & ~(CDF_SCL|CDF_BOOL|CDF_INT|CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, 0, LJ_ERR_FFI_INVTYPE);
      info |= CTF_BOOL;
      if (!(cds & CDF_SIGNED)) info |= CTF_UNSIGNED;
      if (!sz) {
	sz = 1;
      }
    } else if ((cds & CDF_FP)) {
      info = CTINFO(CT_NUM, CTF_FP);
      if ((cds & CDF_LONG)) sz = sizeof(long double);
    } else if ((cds & CDF_CHAR)) {
      if ((cds & (CDF_CHAR|CDF_SIGNED|CDF_UNSIGNED)) == CDF_CHAR)
	info |= CTF_UCHAR;  /* Handle platforms where char is unsigned. */
    } else if ((cds & CDF_SHORT)) {
      sz = sizeof(short);
    } else if ((cds & CDF_LONGLONG)) {
      sz = 8;
    } else if ((cds & CDF_LONG)) {
      info |= CTF_LONG;
      sz = sizeof(long);
    } else if (!sz) {
      if (!(cds & (CDF_SIGNED|CDF_UNSIGNED)))
	cp_errmsg(cp, cp->tok, LJ_ERR_FFI_DECLSPEC);
      sz = sizeof(int);
    }
    lj_assertCP(sz != 0, "basic ctype with zero size");
    info += CTALIGN(lj_fls(sz));  /* Use natural alignment. */
    info += (decl->attr & CTF_QUAL);  /* Merge qualifiers. */
    cp_push(decl, info, sz);
    decl->attr &= ~CTF_QUAL;
  }
  decl->specpos = decl->pos;
  decl->specattr = decl->attr;
  decl->specfattr = decl->fattr;
  return (cds & CDF_SCL);  /* Return storage class. */
}